

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::
int_writer<long_long,fmt::v5::basic_format_specs<char>>::bin_writer<3>::operator()
          (bin_writer<3> *this,ostream_iterator<char,_char,_std::char_traits<char>_> *it)

{
  int iVar1;
  bool bVar2;
  byte *pbVar3;
  ulong uVar4;
  long lVar5;
  char *__value;
  char buffer [23];
  ostream_iterator<char,_char,_std::char_traits<char>_> local_48;
  char local_38 [24];
  
  local_48._M_stream = it->_M_stream;
  local_48._M_string = it->_M_string;
  iVar1 = *(int *)(this + 8);
  lVar5 = (long)iVar1;
  __value = local_38;
  pbVar3 = (byte *)(local_38 + lVar5 + -1);
  uVar4 = *(ulong *)this;
  do {
    *pbVar3 = (byte)uVar4 & 7 | 0x30;
    pbVar3 = pbVar3 + -1;
    bVar2 = 7 < uVar4;
    uVar4 = uVar4 >> 3;
  } while (bVar2);
  if (0 < iVar1) {
    do {
      std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(&local_48,__value);
      __value = __value + 1;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  it->_M_stream = local_48._M_stream;
  it->_M_string = local_48._M_string;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_uint<BITS, char_type>(it, abs_value, num_digits);
      }